

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::leave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int leaveIdx,bool polish)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  double dVar1;
  bool bVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  undefined8 uVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *y;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *y_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  *this_01;
  pointer pnVar5;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar6;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  type_conflict5 tVar7;
  bool bVar8;
  int iVar9;
  int extraout_var;
  undefined4 extraout_var_00;
  SPxOut *pSVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  undefined7 in_register_00000011;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  uint *puVar15;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  pointer pnVar20;
  multiprecision *pmVar21;
  byte bVar22;
  ulong uVar23;
  Real RVar24;
  SPxStatus SVar25;
  Status leaveStat;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d88;
  uint local_d80;
  int leaveNum;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d78;
  DataKey local_d70;
  SPxId leaveId;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterBound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  reject_treshold;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newUBbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leaveMax;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newCoPrhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newLBbound;
  cpp_dec_float<200U,_int,_void> local_7a8;
  uint local_720 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  cpp_dec_float<200U,_int,_void> local_630;
  uint local_5b0 [28];
  int local_540;
  undefined1 local_53c;
  fpclass_type local_538;
  int32_t iStack_534;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  multiprecision local_430 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  multiprecision local_2b0 [112];
  int local_240;
  undefined1 local_23c;
  fpclass_type local_238;
  int32_t iStack_234;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  local_d78 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(local_d78._4_4_,(int)CONCAT71(in_register_00000011,polish));
  bVar2 = this->instableLeave;
  pUVar3 = this->theCoPvec;
  if (((pUVar3->thedelta).setupStatus == true) && ((pUVar3->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::coSolve(&this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&pUVar3->thedelta,
              &(this->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[leaveIdx].
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  }
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x86])(this);
  leaveId.super_DataKey.info = 0;
  leaveId.super_DataKey.idx = -1;
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  leaveMax.m_backend.fpclass = cpp_dec_float_finite;
  leaveMax.m_backend.prec_elem = 0x1c;
  leaveMax.m_backend.data._M_elems[0] = 0;
  leaveMax.m_backend.data._M_elems[1] = 0;
  leaveMax.m_backend.data._M_elems[2] = 0;
  leaveMax.m_backend.data._M_elems[3] = 0;
  leaveMax.m_backend.data._M_elems[4] = 0;
  leaveMax.m_backend.data._M_elems[5] = 0;
  leaveMax.m_backend.data._M_elems[6] = 0;
  leaveMax.m_backend.data._M_elems[7] = 0;
  leaveMax.m_backend.data._M_elems[8] = 0;
  leaveMax.m_backend.data._M_elems[9] = 0;
  leaveMax.m_backend.data._M_elems[10] = 0;
  leaveMax.m_backend.data._M_elems[0xb] = 0;
  leaveMax.m_backend.data._M_elems[0xc] = 0;
  leaveMax.m_backend.data._M_elems[0xd] = 0;
  leaveMax.m_backend.data._M_elems[0xe] = 0;
  leaveMax.m_backend.data._M_elems[0xf] = 0;
  leaveMax.m_backend.data._M_elems[0x10] = 0;
  leaveMax.m_backend.data._M_elems[0x11] = 0;
  leaveMax.m_backend.data._M_elems[0x12] = 0;
  leaveMax.m_backend.data._M_elems[0x13] = 0;
  leaveMax.m_backend.data._M_elems[0x14] = 0;
  leaveMax.m_backend.data._M_elems[0x15] = 0;
  leaveMax.m_backend.data._M_elems[0x16] = 0;
  leaveMax.m_backend.data._M_elems[0x17] = 0;
  leaveMax.m_backend.data._M_elems[0x18] = 0;
  leaveMax.m_backend.data._M_elems[0x19] = 0;
  leaveMax.m_backend.data._M_elems._104_5_ = 0;
  leaveMax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leaveMax.m_backend.exp = 0;
  leaveMax.m_backend.neg = false;
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 0x1c;
  leavebound.m_backend.data._M_elems[0] = 0;
  leavebound.m_backend.data._M_elems[1] = 0;
  leavebound.m_backend.data._M_elems[2] = 0;
  leavebound.m_backend.data._M_elems[3] = 0;
  leavebound.m_backend.data._M_elems[4] = 0;
  leavebound.m_backend.data._M_elems[5] = 0;
  leavebound.m_backend.data._M_elems[6] = 0;
  leavebound.m_backend.data._M_elems[7] = 0;
  leavebound.m_backend.data._M_elems[8] = 0;
  leavebound.m_backend.data._M_elems[9] = 0;
  leavebound.m_backend.data._M_elems[10] = 0;
  leavebound.m_backend.data._M_elems[0xb] = 0;
  leavebound.m_backend.data._M_elems[0xc] = 0;
  leavebound.m_backend.data._M_elems[0xd] = 0;
  leavebound.m_backend.data._M_elems[0xe] = 0;
  leavebound.m_backend.data._M_elems[0xf] = 0;
  leavebound.m_backend.data._M_elems[0x10] = 0;
  leavebound.m_backend.data._M_elems[0x11] = 0;
  leavebound.m_backend.data._M_elems[0x12] = 0;
  leavebound.m_backend.data._M_elems[0x13] = 0;
  leavebound.m_backend.data._M_elems[0x14] = 0;
  leavebound.m_backend.data._M_elems[0x15] = 0;
  leavebound.m_backend.data._M_elems[0x16] = 0;
  leavebound.m_backend.data._M_elems[0x17] = 0;
  leavebound.m_backend.data._M_elems[0x18] = 0;
  leavebound.m_backend.data._M_elems[0x19] = 0;
  leavebound.m_backend.data._M_elems._104_5_ = 0;
  leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&local_9a8);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x7f])
            (this,leaveIdx,&leaveStat,&leaveId,&leaveMax,&leavebound,&leaveNum,&local_9a8);
  if (((char)local_d78 == '\0') && (this->m_maxCycle < this->m_numCycle)) {
    local_c28.m_backend.data._M_elems[0] = 0;
    tVar7 = boost::multiprecision::operator>(&leaveMax,(int *)&local_c28);
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[(ulong)tVar7 + 0x8b])(this);
    forceRecompNonbasicValue(this);
  }
  lVar13 = 0x1c;
  pnVar16 = &leaveMax;
  pnVar19 = &local_c28;
  for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_c28.m_backend.exp = leaveMax.m_backend.exp;
  local_c28.m_backend.neg = leaveMax.m_backend.neg;
  local_c28.m_backend.fpclass = leaveMax.m_backend.fpclass;
  local_c28.m_backend.prec_elem = leaveMax.m_backend.prec_elem;
  this->boundflips = 0;
  pnVar16 = &this->theShift;
  puVar15 = local_720;
  for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar15 = (pnVar16->m_backend).data._M_elems[0];
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + (ulong)bVar22 * -8 + 4);
    puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
  }
  iVar9 = (this->theShift).m_backend.exp;
  bVar8 = (this->theShift).m_backend.neg;
  uVar4._0_4_ = (this->theShift).m_backend.fpclass;
  uVar4._4_4_ = (this->theShift).m_backend.prec_elem;
  local_d88 = this;
  local_d80 = leaveIdx;
  local_d70.info =
       (*this->theratiotester->_vptr_SPxRatioTester[8])
                 (this->theratiotester,&local_c28,leaveIdx,(ulong)local_d78 & 0xff);
  this_02 = local_d88;
  local_d70.idx = extraout_var;
  pnVar16 = &this->theShift;
  pnVar19 = &local_b0;
  for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + (ulong)bVar22 * -8 + 4);
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (local_d88->theShift).m_backend.exp;
  local_b0.m_backend.neg = (local_d88->theShift).m_backend.neg;
  local_b0.m_backend.fpclass = (local_d88->theShift).m_backend.fpclass;
  local_b0.m_backend.prec_elem = (local_d88->theShift).m_backend.prec_elem;
  puVar15 = local_720;
  pnVar16 = &local_130;
  for (; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = *puVar15;
    puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = iVar9;
  local_130.m_backend.neg = bVar8;
  local_130.m_backend._120_8_ = uVar4;
  RVar24 = Tolerances::epsilon((local_d88->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_b0,&local_130,RVar24);
  if (bVar8) {
    forceRecompNonbasicValue(this_02);
  }
  this_02->instableLeaveNum = -1;
  this_02->instableLeave = false;
  if (local_d70.info == 0) {
    (*(this_02->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x85])
              (this_02,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
    (**(this_02->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)
              (&this_02->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,0xffffffffffffffff,&none,0,0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&reject_treshold.m_backend,0.0,(type *)0x0);
    pcVar17 = &reject_treshold.m_backend;
    pSVar18 = &local_9a8;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pSVar18->sum).m_backend.data._M_elems[0] = (pcVar17->data)._M_elems[0];
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
      pSVar18 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pSVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_9a8.sum.m_backend.exp = reject_treshold.m_backend.exp;
    local_9a8.sum.m_backend.neg = reject_treshold.m_backend.neg;
    local_9a8.sum.m_backend.fpclass = reject_treshold.m_backend.fpclass;
    local_9a8.sum.m_backend.prec_elem = reject_treshold.m_backend.prec_elem;
    if ((char)local_d78 != '\0') {
      return (bool)0;
    }
    lVar13 = 0x1c;
    pnVar16 = &local_c28;
    pnVar19 = &local_1b0;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_c28.m_backend.exp;
    local_1b0.m_backend.neg = local_c28.m_backend.neg;
    local_1b0.m_backend.fpclass = local_c28.m_backend.fpclass;
    local_1b0.m_backend.prec_elem = local_c28.m_backend.prec_elem;
    pnVar16 = &leaveMax;
    pnVar19 = &local_230;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = leaveMax.m_backend.exp;
    local_230.m_backend.neg = leaveMax.m_backend.neg;
    local_230.m_backend.fpclass = leaveMax.m_backend.fpclass;
    local_230.m_backend.prec_elem = leaveMax.m_backend.prec_elem;
    RVar24 = Tolerances::epsilon((this_02->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_1b0,&local_230,RVar24);
    if (((~bVar8 | bVar2) & 1U) == 0) {
      this_02->instableLeaveNum = local_d80;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this_02->instableLeaveVal).m_backend,
                 &(this_02->theCoTest).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend);
      enterBound.m_backend.data._M_elems[0] = 0;
      enterBound.m_backend.data._M_elems[1] = 0x40240000;
      reject_treshold.m_backend.fpclass = cpp_dec_float_finite;
      reject_treshold.m_backend.prec_elem = 0x1c;
      reject_treshold.m_backend.data._M_elems[0] = 0;
      reject_treshold.m_backend.data._M_elems[1] = 0;
      reject_treshold.m_backend.data._M_elems[2] = 0;
      reject_treshold.m_backend.data._M_elems[3] = 0;
      reject_treshold.m_backend.data._M_elems[4] = 0;
      reject_treshold.m_backend.data._M_elems[5] = 0;
      reject_treshold.m_backend.data._M_elems[6] = 0;
      reject_treshold.m_backend.data._M_elems[7] = 0;
      reject_treshold.m_backend.data._M_elems[8] = 0;
      reject_treshold.m_backend.data._M_elems[9] = 0;
      reject_treshold.m_backend.data._M_elems[10] = 0;
      reject_treshold.m_backend.data._M_elems[0xb] = 0;
      reject_treshold.m_backend.data._M_elems[0xc] = 0;
      reject_treshold.m_backend.data._M_elems[0xd] = 0;
      reject_treshold.m_backend.data._M_elems[0xe] = 0;
      reject_treshold.m_backend.data._M_elems[0xf] = 0;
      reject_treshold.m_backend.data._M_elems[0x10] = 0;
      reject_treshold.m_backend.data._M_elems[0x11] = 0;
      reject_treshold.m_backend.data._M_elems[0x12] = 0;
      reject_treshold.m_backend.data._M_elems[0x13] = 0;
      reject_treshold.m_backend.data._M_elems[0x14] = 0;
      reject_treshold.m_backend.data._M_elems[0x15] = 0;
      reject_treshold.m_backend.data._M_elems[0x16] = 0;
      reject_treshold.m_backend.data._M_elems[0x17] = 0;
      reject_treshold.m_backend.data._M_elems[0x18] = 0;
      reject_treshold.m_backend.data._M_elems[0x19] = 0;
      reject_treshold.m_backend.data._M_elems._104_5_ = 0;
      reject_treshold.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      reject_treshold.m_backend.exp = 0;
      reject_treshold.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&reject_treshold.m_backend,&(this_02->instableLeaveVal).m_backend,
                 (double *)&enterBound);
      pnVar5 = (this_02->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar17 = &reject_treshold.m_backend;
      pnVar20 = pnVar5 + leaveIdx;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      pnVar5[leaveIdx].m_backend.exp = reject_treshold.m_backend.exp;
      pnVar5[leaveIdx].m_backend.neg = reject_treshold.m_backend.neg;
      pnVar5[leaveIdx].m_backend.fpclass = reject_treshold.m_backend.fpclass;
      pnVar5[leaveIdx].m_backend.prec_elem = reject_treshold.m_backend.prec_elem;
      return (bool)1;
    }
    if (1 < (this_02->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).updateCount) {
      pSVar10 = this_02->spxout;
      if ((pSVar10 != (SPxOut *)0x0) && (4 < (int)pSVar10->m_verbosity)) {
        reject_treshold.m_backend.data._M_elems[0] = pSVar10->m_verbosity;
        enterBound.m_backend.data._M_elems[0] = 5;
        (*pSVar10->_vptr_SPxOut[2])();
        pSVar10 = soplex::operator<<(this_02->spxout,"ILEAVE01 factorization triggered in ");
        pSVar10 = soplex::operator<<(pSVar10,"leave() for feasibility test");
        std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
        (*this_02->spxout->_vptr_SPxOut[2])(this_02->spxout,&reject_treshold);
      }
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x75])(this_02);
      return (bool)1;
    }
    if (this_02->recomputedVectors == false) {
      pnVar16 = &local_c28;
      pmVar21 = local_2b0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(uint *)pmVar21 = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pmVar21 = pmVar21 + (ulong)bVar22 * -8 + 4;
      }
      local_240 = local_c28.m_backend.exp;
      local_23c = local_c28.m_backend.neg;
      local_238 = local_c28.m_backend.fpclass;
      iStack_234 = local_c28.m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&reject_treshold,local_2b0,&local_c28);
      leavetol(&enterBound,this_02);
      tVar7 = boost::multiprecision::operator<(&reject_treshold,&enterBound);
      if (tVar7) {
        pSVar10 = this_02->spxout;
        if ((pSVar10 != (SPxOut *)0x0) && (4 < (int)pSVar10->m_verbosity)) {
          reject_treshold.m_backend.data._M_elems[0] = pSVar10->m_verbosity;
          enterBound.m_backend.data._M_elems[0] = 5;
          (*pSVar10->_vptr_SPxOut[2])();
          pSVar10 = soplex::operator<<(this_02->spxout,
                                       "ILEAVE11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
          (*this_02->spxout->_vptr_SPxOut[2])(this_02->spxout,&reject_treshold);
        }
        computeFrhs(this_02);
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::solve(&this_02->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this_02->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,this_02->theFrhs);
        computeFtest(this_02);
        this_02->recomputedVectors = true;
        return (bool)1;
      }
    }
    pSVar10 = this_02->spxout;
    if ((pSVar10 != (SPxOut *)0x0) && (4 < (int)pSVar10->m_verbosity)) {
      reject_treshold.m_backend.data._M_elems[0] = pSVar10->m_verbosity;
      enterBound.m_backend.data._M_elems[0] = 5;
      (*pSVar10->_vptr_SPxOut[2])();
      pSVar10 = soplex::operator<<(this_02->spxout,"ILEAVE02 unboundedness/infeasibility found ");
      pSVar10 = soplex::operator<<(pSVar10,"in leave()");
      std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
      (*this_02->spxout->_vptr_SPxOut[2])(this_02->spxout,&reject_treshold);
    }
    if (this_02->theRep == COLUMN) {
      pnVar16 = &local_c28;
      pnVar19 = &local_3b0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = local_c28.m_backend.exp;
      local_3b0.m_backend.neg = local_c28.m_backend.neg;
      local_3b0.m_backend.fpclass = local_c28.m_backend.fpclass;
      local_3b0.m_backend.prec_elem = local_c28.m_backend.prec_elem;
      computeDualfarkas4Col(this_02,&local_3b0);
      SVar25 = INFEASIBLE;
    }
    else {
      pnVar16 = &local_c28;
      pnVar19 = &local_330;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = local_c28.m_backend.exp;
      local_330.m_backend.neg = local_c28.m_backend.neg;
      local_330.m_backend.fpclass = local_c28.m_backend.fpclass;
      local_330.m_backend.prec_elem = local_c28.m_backend.prec_elem;
      computePrimalray4Row(this_02,&local_330);
      SVar25 = UNBOUNDED;
    }
    setBasisStatus(this_02,SVar25);
    return (bool)0;
  }
  this_00 = &this_02->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  if (&local_d70 ==
      &(this_02->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).theBaseId.data[leaveIdx].super_DataKey) {
    (**(this_02->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)(this_00,(ulong)local_d80,&none,0,0);
    pDVar6 = &(this_02->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat;
    if (leaveId.super_DataKey.info < 0) {
      pDVar6 = &(this_02->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat;
    }
    lVar13 = (long)leaveNum;
    if (leaveStat == P_ON_UPPER) {
      pDVar6->data[lVar13] = P_ON_LOWER;
      pVVar14 = &this_02->theLCbound;
      if (leaveId.super_DataKey.info < 0) {
        pVVar14 = &this_02->theLRbound;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this_02->theCoPrhs->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend,
                 &(pVVar14->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this_02->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend,0);
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&reject_treshold.m_backend,-*pdVar11,(type *)0x0);
      pnVar5 = (this_02->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar17 = &reject_treshold.m_backend;
      pnVar20 = pnVar5 + leaveIdx;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      pnVar5[leaveIdx].m_backend.exp = reject_treshold.m_backend.exp;
      pnVar5[leaveIdx].m_backend.neg = reject_treshold.m_backend.neg;
      pnVar5[leaveIdx].m_backend.fpclass = reject_treshold.m_backend.fpclass;
      pnVar5[leaveIdx].m_backend.prec_elem = reject_treshold.m_backend.prec_elem;
    }
    else {
      pDVar6->data[lVar13] = P_ON_UPPER;
      pVVar14 = &this_02->theUCbound;
      if (leaveId.super_DataKey.info < 0) {
        pVVar14 = &this_02->theURbound;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this_02->theCoPrhs->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend,
                 &(pVVar14->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend);
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&reject_treshold.m_backend,*pdVar11,(type *)0x0);
      pnVar5 = (this_02->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar17 = &reject_treshold.m_backend;
      pnVar20 = pnVar5 + leaveIdx;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      pnVar5[leaveIdx].m_backend.exp = reject_treshold.m_backend.exp;
      pnVar5[leaveIdx].m_backend.neg = reject_treshold.m_backend.neg;
      pnVar5[leaveIdx].m_backend.fpclass = reject_treshold.m_backend.fpclass;
      pnVar5[leaveIdx].m_backend.prec_elem = reject_treshold.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this_02->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend,0);
    }
    pUVar3 = this_02->theCoPvec;
    lVar13 = 0x1c;
    pnVar16 = &local_c28;
    pnVar19 = &pUVar3->theval;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar22 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_c28.m_backend.exp;
    (pUVar3->theval).m_backend.neg = local_c28.m_backend.neg;
    (pUVar3->theval).m_backend.fpclass = local_c28.m_backend.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_c28.m_backend.prec_elem;
    pUVar3 = this_02->thePvec;
    pnVar16 = &local_c28;
    pnVar19 = &pUVar3->theval;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar22 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_c28.m_backend.exp;
    (pUVar3->theval).m_backend.neg = local_c28.m_backend.neg;
    (pUVar3->theval).m_backend.fpclass = local_c28.m_backend.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_c28.m_backend.prec_elem;
    epsilon(&reject_treshold,this_02);
    tVar7 = boost::multiprecision::operator>(&local_c28,&reject_treshold);
    if (tVar7) {
LAB_003d9b65:
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x87])(this_02);
    }
    else {
      epsilon(&newUBbound,this_02);
      pnVar16 = &newUBbound;
      pnVar19 = &enterBound;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      enterBound.m_backend.exp = newUBbound.m_backend.exp;
      enterBound.m_backend.neg = newUBbound.m_backend.neg;
      enterBound.m_backend.fpclass = newUBbound.m_backend.fpclass;
      enterBound.m_backend.prec_elem = newUBbound.m_backend.prec_elem;
      if (newUBbound.m_backend.fpclass != cpp_dec_float_finite ||
          enterBound.m_backend.data._M_elems[0] != 0) {
        enterBound.m_backend.neg = (bool)(newUBbound.m_backend.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator<(&local_c28,&enterBound);
      if (tVar7) goto LAB_003d9b65;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this_02->theFvec->theval).m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&(this_02->m_pricingViol).m_backend,
               &(this_02->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend);
    boost::multiprecision::backends::eval_multiply<200u,int,void>
              (&(this_02->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend,-1);
  }
  else {
    iVar9 = (*(this_02->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x7e])(this_02,&local_d70);
    local_d78 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(extraout_var_00,iVar9);
    y = this_02->solveVector2;
    y_00 = this_02->solveVector3;
    x = &this_02->theFvec->thedelta;
    if (y == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0) {
      if (y_00 != (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::solve4update(this_00,x,y_00,local_d78,this_02->solveVector3rhs);
        goto LAB_003d99be;
      }
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(this_00,x,local_d78);
    }
    else if (y_00 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x0) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(this_00,x,y,local_d78,this_02->solveVector2rhs);
    }
    else {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(this_00,x,y,y_00,local_d78,this_02->solveVector2rhs,this_02->solveVector3rhs);
LAB_003d99be:
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator-=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)&this_02->primVec,this_02->solveVector3);
      this_02->totalboundflips = this_02->totalboundflips + this_02->boundflips;
    }
    dVar1 = ((this_02->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->s_epsilon_multiplier;
    uVar23 = -(ulong)(dVar1 == 1.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&reject_treshold.m_backend,
               (double)(~uVar23 & (ulong)(dVar1 * 1e-10) | uVar23 & 0x3ddb7cdfd9d7bdbb),(type *)0x0)
    ;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_430,&this_02->theFvec->thedelta,local_d80);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&enterBound,local_430,arg);
    tVar7 = boost::multiprecision::operator<
                      (&enterBound,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&reject_treshold.m_backend);
    if (tVar7) {
      if (bVar2 == false) {
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clear(&this_02->theFvec->thedelta);
        (*(this_02->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x85])
                  (this_02,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,
                   local_d78);
        (**(this_02->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._vptr_SPxBasisBase)(this_00,0xffffffffffffffff,&none,0,0);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&enterBound.m_backend,0.0,(type *)0x0);
        pcVar17 = &enterBound.m_backend;
        pSVar18 = &local_9a8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pSVar18->sum).m_backend.data._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          pSVar18 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pSVar18 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        local_9a8.sum.m_backend.exp = enterBound.m_backend.exp;
        local_9a8.sum.m_backend.neg = enterBound.m_backend.neg;
        local_9a8.sum.m_backend.fpclass = enterBound.m_backend.fpclass;
        local_9a8.sum.m_backend.prec_elem = enterBound.m_backend.prec_elem;
        enterBound.m_backend.data._M_elems[0] = 0x47ae147b;
        enterBound.m_backend.data._M_elems[1] = 0x3f847ae1;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&(this_02->theCoTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend,
                   (double *)&enterBound);
      }
      else {
        pSVar10 = this_02->spxout;
        if ((pSVar10 != (SPxOut *)0x0) && (4 < (int)pSVar10->m_verbosity)) {
          enterBound.m_backend.data._M_elems[0] = pSVar10->m_verbosity;
          newUBbound.m_backend.data._M_elems[0] = 5;
          (*pSVar10->_vptr_SPxOut[2])();
          pSVar10 = soplex::operator<<(this_02->spxout,"ILEAVE03 unboundedness/infeasibility found "
                                      );
          pSVar10 = soplex::operator<<(pSVar10,"in leave()");
          std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
          (*this_02->spxout->_vptr_SPxOut[2])(this_02->spxout,&enterBound);
        }
        (*(this_02->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x85])
                  (this_02,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
        (**(this_02->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._vptr_SPxBasisBase)(this_00,0xffffffffffffffff,&none,0,0);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&enterBound.m_backend,0.0,(type *)0x0);
        pcVar17 = &enterBound.m_backend;
        pSVar18 = &local_9a8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pSVar18->sum).m_backend.data._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          pSVar18 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pSVar18 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        local_9a8.sum.m_backend.exp = enterBound.m_backend.exp;
        local_9a8.sum.m_backend.neg = enterBound.m_backend.neg;
        local_9a8.sum.m_backend.fpclass = enterBound.m_backend.fpclass;
        local_9a8.sum.m_backend.prec_elem = enterBound.m_backend.prec_elem;
        if (this_02->theRep == ROW) {
          pnVar16 = &local_c28;
          pnVar19 = &local_4b0;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          local_4b0.m_backend.exp = local_c28.m_backend.exp;
          local_4b0.m_backend.neg = local_c28.m_backend.neg;
          local_4b0.m_backend.fpclass = local_c28.m_backend.fpclass;
          local_4b0.m_backend.prec_elem = local_c28.m_backend.prec_elem;
          computePrimalray4Row(this_02,&local_4b0);
          SVar25 = UNBOUNDED;
        }
        else {
          pnVar16 = &local_c28;
          pnVar19 = &local_530;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          local_530.m_backend.exp = local_c28.m_backend.exp;
          local_530.m_backend.neg = local_c28.m_backend.neg;
          local_530.m_backend.fpclass = local_c28.m_backend.fpclass;
          local_530.m_backend.prec_elem = local_c28.m_backend.prec_elem;
          computeDualfarkas4Col(this_02,&local_530);
          SVar25 = INFEASIBLE;
        }
        setBasisStatus(this_02,SVar25);
      }
      return (bool)(bVar2 ^ 1);
    }
    epsilon(&enterBound,this_02);
    tVar7 = boost::multiprecision::operator>(&leavebound,&enterBound);
    if (tVar7) {
LAB_003d9fa6:
      this_01 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)this_02->theFrhs;
      pnVar16 = &leavebound;
      pnVar19 = &enterBound;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      enterBound.m_backend.exp = leavebound.m_backend.exp;
      enterBound.m_backend.neg = leavebound.m_backend.neg;
      enterBound.m_backend.fpclass = leavebound.m_backend.fpclass;
      enterBound.m_backend.prec_elem = leavebound.m_backend.prec_elem;
      if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
          enterBound.m_backend.data._M_elems[0] != 0) {
        enterBound.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (this_01,&enterBound,
                 (this_02->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).matrix.data[leaveIdx]);
    }
    else {
      epsilon(&newLBbound,this_02);
      pnVar16 = &newLBbound;
      pnVar19 = &newUBbound;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      newUBbound.m_backend.exp = newLBbound.m_backend.exp;
      newUBbound.m_backend.neg = newLBbound.m_backend.neg;
      newUBbound.m_backend.fpclass = newLBbound.m_backend.fpclass;
      newUBbound.m_backend.prec_elem = newLBbound.m_backend.prec_elem;
      if (newLBbound.m_backend.fpclass != cpp_dec_float_finite ||
          newUBbound.m_backend.data._M_elems[0] != 0) {
        newUBbound.m_backend.neg = (bool)(newLBbound.m_backend.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator<(&leavebound,&newUBbound);
      if (tVar7) goto LAB_003d9fa6;
    }
    enterBound.m_backend.fpclass = cpp_dec_float_finite;
    enterBound.m_backend.prec_elem = 0x1c;
    enterBound.m_backend.data._M_elems[0] = 0;
    enterBound.m_backend.data._M_elems[1] = 0;
    enterBound.m_backend.data._M_elems[2] = 0;
    enterBound.m_backend.data._M_elems[3] = 0;
    enterBound.m_backend.data._M_elems[4] = 0;
    enterBound.m_backend.data._M_elems[5] = 0;
    enterBound.m_backend.data._M_elems[6] = 0;
    enterBound.m_backend.data._M_elems[7] = 0;
    enterBound.m_backend.data._M_elems[8] = 0;
    enterBound.m_backend.data._M_elems[9] = 0;
    enterBound.m_backend.data._M_elems[10] = 0;
    enterBound.m_backend.data._M_elems[0xb] = 0;
    enterBound.m_backend.data._M_elems[0xc] = 0;
    enterBound.m_backend.data._M_elems[0xd] = 0;
    enterBound.m_backend.data._M_elems[0xe] = 0;
    enterBound.m_backend.data._M_elems[0xf] = 0;
    enterBound.m_backend.data._M_elems[0x10] = 0;
    enterBound.m_backend.data._M_elems[0x11] = 0;
    enterBound.m_backend.data._M_elems[0x12] = 0;
    enterBound.m_backend.data._M_elems[0x13] = 0;
    enterBound.m_backend.data._M_elems[0x14] = 0;
    enterBound.m_backend.data._M_elems[0x15] = 0;
    enterBound.m_backend.data._M_elems[0x16] = 0;
    enterBound.m_backend.data._M_elems[0x17] = 0;
    enterBound.m_backend.data._M_elems[0x18] = 0;
    enterBound.m_backend.data._M_elems[0x19] = 0;
    enterBound.m_backend.data._M_elems._104_5_ = 0;
    enterBound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    enterBound.m_backend.exp = 0;
    enterBound.m_backend.neg = false;
    newUBbound.m_backend.fpclass = cpp_dec_float_finite;
    newUBbound.m_backend.prec_elem = 0x1c;
    newUBbound.m_backend.data._M_elems[0] = 0;
    newUBbound.m_backend.data._M_elems[1] = 0;
    newUBbound.m_backend.data._M_elems[2] = 0;
    newUBbound.m_backend.data._M_elems[3] = 0;
    newUBbound.m_backend.data._M_elems[4] = 0;
    newUBbound.m_backend.data._M_elems[5] = 0;
    newUBbound.m_backend.data._M_elems[6] = 0;
    newUBbound.m_backend.data._M_elems[7] = 0;
    newUBbound.m_backend.data._M_elems[8] = 0;
    newUBbound.m_backend.data._M_elems[9] = 0;
    newUBbound.m_backend.data._M_elems[10] = 0;
    newUBbound.m_backend.data._M_elems[0xb] = 0;
    newUBbound.m_backend.data._M_elems[0xc] = 0;
    newUBbound.m_backend.data._M_elems[0xd] = 0;
    newUBbound.m_backend.data._M_elems[0xe] = 0;
    newUBbound.m_backend.data._M_elems[0xf] = 0;
    newUBbound.m_backend.data._M_elems[0x10] = 0;
    newUBbound.m_backend.data._M_elems[0x11] = 0;
    newUBbound.m_backend.data._M_elems[0x12] = 0;
    newUBbound.m_backend.data._M_elems[0x13] = 0;
    newUBbound.m_backend.data._M_elems[0x14] = 0;
    newUBbound.m_backend.data._M_elems[0x15] = 0;
    newUBbound.m_backend.data._M_elems[0x16] = 0;
    newUBbound.m_backend.data._M_elems[0x17] = 0;
    newUBbound.m_backend.data._M_elems[0x18] = 0;
    newUBbound.m_backend.data._M_elems[0x19] = 0;
    newUBbound.m_backend.data._M_elems._104_5_ = 0;
    newUBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    newUBbound.m_backend.exp = 0;
    newUBbound.m_backend.neg = false;
    newLBbound.m_backend.fpclass = cpp_dec_float_finite;
    newLBbound.m_backend.prec_elem = 0x1c;
    newLBbound.m_backend.data._M_elems[0] = 0;
    newLBbound.m_backend.data._M_elems[1] = 0;
    newLBbound.m_backend.data._M_elems[2] = 0;
    newLBbound.m_backend.data._M_elems[3] = 0;
    newLBbound.m_backend.data._M_elems[4] = 0;
    newLBbound.m_backend.data._M_elems[5] = 0;
    newLBbound.m_backend.data._M_elems[6] = 0;
    newLBbound.m_backend.data._M_elems[7] = 0;
    newLBbound.m_backend.data._M_elems[8] = 0;
    newLBbound.m_backend.data._M_elems[9] = 0;
    newLBbound.m_backend.data._M_elems[10] = 0;
    newLBbound.m_backend.data._M_elems[0xb] = 0;
    newLBbound.m_backend.data._M_elems[0xc] = 0;
    newLBbound.m_backend.data._M_elems[0xd] = 0;
    newLBbound.m_backend.data._M_elems[0xe] = 0;
    newLBbound.m_backend.data._M_elems[0xf] = 0;
    newLBbound.m_backend.data._M_elems[0x10] = 0;
    newLBbound.m_backend.data._M_elems[0x11] = 0;
    newLBbound.m_backend.data._M_elems[0x12] = 0;
    newLBbound.m_backend.data._M_elems[0x13] = 0;
    newLBbound.m_backend.data._M_elems[0x14] = 0;
    newLBbound.m_backend.data._M_elems[0x15] = 0;
    newLBbound.m_backend.data._M_elems[0x16] = 0;
    newLBbound.m_backend.data._M_elems[0x17] = 0;
    newLBbound.m_backend.data._M_elems[0x18] = 0;
    newLBbound.m_backend.data._M_elems[0x19] = 0;
    newLBbound.m_backend.data._M_elems._104_5_ = 0;
    newLBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    newLBbound.m_backend.exp = 0;
    newLBbound.m_backend.neg = false;
    newCoPrhs.m_backend.fpclass = cpp_dec_float_finite;
    newCoPrhs.m_backend.prec_elem = 0x1c;
    newCoPrhs.m_backend.data._M_elems[0] = 0;
    newCoPrhs.m_backend.data._M_elems[1] = 0;
    newCoPrhs.m_backend.data._M_elems[2] = 0;
    newCoPrhs.m_backend.data._M_elems[3] = 0;
    newCoPrhs.m_backend.data._M_elems[4] = 0;
    newCoPrhs.m_backend.data._M_elems[5] = 0;
    newCoPrhs.m_backend.data._M_elems[6] = 0;
    newCoPrhs.m_backend.data._M_elems[7] = 0;
    newCoPrhs.m_backend.data._M_elems[8] = 0;
    newCoPrhs.m_backend.data._M_elems[9] = 0;
    newCoPrhs.m_backend.data._M_elems[10] = 0;
    newCoPrhs.m_backend.data._M_elems[0xb] = 0;
    newCoPrhs.m_backend.data._M_elems[0xc] = 0;
    newCoPrhs.m_backend.data._M_elems[0xd] = 0;
    newCoPrhs.m_backend.data._M_elems[0xe] = 0;
    newCoPrhs.m_backend.data._M_elems[0xf] = 0;
    newCoPrhs.m_backend.data._M_elems[0x10] = 0;
    newCoPrhs.m_backend.data._M_elems[0x11] = 0;
    newCoPrhs.m_backend.data._M_elems[0x12] = 0;
    newCoPrhs.m_backend.data._M_elems[0x13] = 0;
    newCoPrhs.m_backend.data._M_elems[0x14] = 0;
    newCoPrhs.m_backend.data._M_elems[0x15] = 0;
    newCoPrhs.m_backend.data._M_elems[0x16] = 0;
    newCoPrhs.m_backend.data._M_elems[0x17] = 0;
    newCoPrhs.m_backend.data._M_elems[0x18] = 0;
    newCoPrhs.m_backend.data._M_elems[0x19] = 0;
    newCoPrhs.m_backend.data._M_elems._104_5_ = 0;
    newCoPrhs.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    newCoPrhs.m_backend.exp = 0;
    newCoPrhs.m_backend.neg = false;
    pnVar16 = &leaveMax;
    puVar15 = local_5b0;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    }
    local_540 = leaveMax.m_backend.exp;
    local_53c = leaveMax.m_backend.neg;
    local_538 = leaveMax.m_backend.fpclass;
    iStack_534 = leaveMax.m_backend.prec_elem;
    (*(this_02->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x80])
              (this_02,local_5b0,local_d70,&enterBound,&newUBbound,&newLBbound,&newCoPrhs,&local_9a8
              );
    pnVar5 = (this_02->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = 0x1c;
    pnVar16 = &newUBbound;
    pnVar20 = pnVar5 + leaveIdx;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    pnVar5[leaveIdx].m_backend.exp = newUBbound.m_backend.exp;
    pnVar5[leaveIdx].m_backend.neg = newUBbound.m_backend.neg;
    pnVar5[leaveIdx].m_backend.fpclass = newUBbound.m_backend.fpclass;
    pnVar5[leaveIdx].m_backend.prec_elem = newUBbound.m_backend.prec_elem;
    pnVar5 = (this_02->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &newLBbound;
    pnVar20 = pnVar5 + leaveIdx;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    pnVar5[leaveIdx].m_backend.exp = newLBbound.m_backend.exp;
    pnVar5[leaveIdx].m_backend.neg = newLBbound.m_backend.neg;
    pnVar5[leaveIdx].m_backend.fpclass = newLBbound.m_backend.fpclass;
    pnVar5[leaveIdx].m_backend.prec_elem = newLBbound.m_backend.prec_elem;
    pnVar5 = (this_02->theCoPrhs->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &newCoPrhs;
    pnVar20 = pnVar5 + leaveIdx;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    pnVar5[leaveIdx].m_backend.exp = newCoPrhs.m_backend.exp;
    pnVar5[leaveIdx].m_backend.neg = newCoPrhs.m_backend.neg;
    pnVar5[leaveIdx].m_backend.fpclass = newCoPrhs.m_backend.fpclass;
    pnVar5[leaveIdx].m_backend.prec_elem = newCoPrhs.m_backend.prec_elem;
    epsilon(&result_5,this_02);
    tVar7 = boost::multiprecision::operator>(&enterBound,&result_5);
    if (tVar7) {
LAB_003da268:
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)this_02->theFrhs,&enterBound,local_d78);
    }
    else {
      epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_7a8,this_02);
      pcVar17 = &local_7a8;
      pnVar16 = &result_2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar16->m_backend).data._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar17->data)->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      result_2.m_backend.exp = local_7a8.exp;
      result_2.m_backend.neg = local_7a8.neg;
      result_2.m_backend.fpclass = local_7a8.fpclass;
      result_2.m_backend.prec_elem = local_7a8.prec_elem;
      if (local_7a8.fpclass != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0) {
        result_2.m_backend.neg = (bool)(local_7a8.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator<(&enterBound,&result_2);
      if (tVar7) goto LAB_003da268;
    }
    pUVar3 = this_02->theCoPvec;
    lVar13 = 0x1c;
    pnVar16 = &local_c28;
    pnVar19 = &pUVar3->theval;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar22 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_c28.m_backend.exp;
    (pUVar3->theval).m_backend.neg = local_c28.m_backend.neg;
    (pUVar3->theval).m_backend.fpclass = local_c28.m_backend.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_c28.m_backend.prec_elem;
    pUVar3 = this_02->thePvec;
    pnVar16 = &local_c28;
    pnVar19 = &pUVar3->theval;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar22 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = local_c28.m_backend.exp;
    (pUVar3->theval).m_backend.neg = local_c28.m_backend.neg;
    (pUVar3->theval).m_backend.fpclass = local_c28.m_backend.fpclass;
    (pUVar3->theval).m_backend.prec_elem = local_c28.m_backend.prec_elem;
    epsilon(&result_5,this_02);
    tVar7 = boost::multiprecision::operator>(&local_c28,&result_5);
    if (tVar7) {
LAB_003da372:
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x87])(this_02);
    }
    else {
      epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_7a8,this_02);
      pcVar17 = &local_7a8;
      pnVar16 = &result_2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar16->m_backend).data._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar17->data)->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      result_2.m_backend.exp = local_7a8.exp;
      result_2.m_backend.neg = local_7a8.neg;
      result_2.m_backend.fpclass = local_7a8.fpclass;
      result_2.m_backend.prec_elem = local_7a8.prec_elem;
      if (local_7a8.fpclass != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0) {
        result_2.m_backend.neg = (bool)(local_7a8.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator<(&local_c28,&result_2);
      if (tVar7) goto LAB_003da372;
    }
    local_7a8.fpclass = cpp_dec_float_finite;
    local_7a8.prec_elem = 0x1c;
    local_7a8.data._M_elems[0] = 0;
    local_7a8.data._M_elems[1] = 0;
    local_7a8.data._M_elems[2] = 0;
    local_7a8.data._M_elems[3] = 0;
    local_7a8.data._M_elems[4] = 0;
    local_7a8.data._M_elems[5] = 0;
    local_7a8.data._M_elems[6] = 0;
    local_7a8.data._M_elems[7] = 0;
    local_7a8.data._M_elems[8] = 0;
    local_7a8.data._M_elems[9] = 0;
    local_7a8.data._M_elems[10] = 0;
    local_7a8.data._M_elems[0xb] = 0;
    local_7a8.data._M_elems[0xc] = 0;
    local_7a8.data._M_elems[0xd] = 0;
    local_7a8.data._M_elems[0xe] = 0;
    local_7a8.data._M_elems[0xf] = 0;
    local_7a8.data._M_elems[0x10] = 0;
    local_7a8.data._M_elems[0x11] = 0;
    local_7a8.data._M_elems[0x12] = 0;
    local_7a8.data._M_elems[0x13] = 0;
    local_7a8.data._M_elems[0x14] = 0;
    local_7a8.data._M_elems[0x15] = 0;
    local_7a8.data._M_elems[0x16] = 0;
    local_7a8.data._M_elems[0x17] = 0;
    local_7a8.data._M_elems[0x18] = 0;
    local_7a8.data._M_elems[0x19] = 0;
    local_7a8.data._M_elems._104_5_ = 0;
    local_7a8.data._M_elems[0x1b]._1_3_ = 0;
    local_7a8.exp = 0;
    local_7a8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_7a8,
               &(this_02->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[leaveIdx].m_backend,&leavebound.m_backend)
    ;
    pcVar17 = &local_7a8;
    pnVar16 = &result_2;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    result_2.m_backend.exp = local_7a8.exp;
    result_2.m_backend.neg = local_7a8.neg;
    result_2.m_backend.fpclass = local_7a8.fpclass;
    result_2.m_backend.prec_elem = local_7a8.prec_elem;
    if (local_7a8.fpclass != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0) {
      result_2.m_backend.neg = (bool)(local_7a8.neg ^ 1);
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_630,&this_02->theFvec->thedelta,local_d80);
    result_5.m_backend.fpclass = cpp_dec_float_finite;
    result_5.m_backend.prec_elem = 0x1c;
    result_5.m_backend.data._M_elems[0] = 0;
    result_5.m_backend.data._M_elems[1] = 0;
    result_5.m_backend.data._M_elems[2] = 0;
    result_5.m_backend.data._M_elems[3] = 0;
    result_5.m_backend.data._M_elems[4] = 0;
    result_5.m_backend.data._M_elems[5] = 0;
    result_5.m_backend.data._M_elems[6] = 0;
    result_5.m_backend.data._M_elems[7] = 0;
    result_5.m_backend.data._M_elems[8] = 0;
    result_5.m_backend.data._M_elems[9] = 0;
    result_5.m_backend.data._M_elems[10] = 0;
    result_5.m_backend.data._M_elems[0xb] = 0;
    result_5.m_backend.data._M_elems[0xc] = 0;
    result_5.m_backend.data._M_elems[0xd] = 0;
    result_5.m_backend.data._M_elems[0xe] = 0;
    result_5.m_backend.data._M_elems[0xf] = 0;
    result_5.m_backend.data._M_elems[0x10] = 0;
    result_5.m_backend.data._M_elems[0x11] = 0;
    result_5.m_backend.data._M_elems[0x12] = 0;
    result_5.m_backend.data._M_elems[0x13] = 0;
    result_5.m_backend.data._M_elems[0x14] = 0;
    result_5.m_backend.data._M_elems[0x15] = 0;
    result_5.m_backend.data._M_elems[0x16] = 0;
    result_5.m_backend.data._M_elems[0x17] = 0;
    result_5.m_backend.data._M_elems[0x18] = 0;
    result_5.m_backend.data._M_elems[0x19] = 0;
    result_5.m_backend.data._M_elems._104_5_ = 0;
    result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_5.m_backend.exp = 0;
    result_5.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_5.m_backend,&result_2.m_backend,&local_630);
    pUVar3 = this_02->theFvec;
    lVar13 = 0x1c;
    pcVar17 = &result_5.m_backend;
    pnVar16 = &pUVar3->theval;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar22 * -8 + 4);
    }
    (pUVar3->theval).m_backend.exp = result_5.m_backend.exp;
    (pUVar3->theval).m_backend.neg = result_5.m_backend.neg;
    (pUVar3->theval).m_backend.fpclass = result_5.m_backend.fpclass;
    (pUVar3->theval).m_backend.prec_elem = result_5.m_backend.prec_elem;
    UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::update(this_02->theFvec);
    result_5.m_backend.fpclass = cpp_dec_float_finite;
    result_5.m_backend.prec_elem = 0x1c;
    result_5.m_backend.data._M_elems[0] = 0;
    result_5.m_backend.data._M_elems[1] = 0;
    result_5.m_backend.data._M_elems[2] = 0;
    result_5.m_backend.data._M_elems[3] = 0;
    result_5.m_backend.data._M_elems[4] = 0;
    result_5.m_backend.data._M_elems[5] = 0;
    result_5.m_backend.data._M_elems[6] = 0;
    result_5.m_backend.data._M_elems[7] = 0;
    result_5.m_backend.data._M_elems[8] = 0;
    result_5.m_backend.data._M_elems[9] = 0;
    result_5.m_backend.data._M_elems[10] = 0;
    result_5.m_backend.data._M_elems[0xb] = 0;
    result_5.m_backend.data._M_elems[0xc] = 0;
    result_5.m_backend.data._M_elems[0xd] = 0;
    result_5.m_backend.data._M_elems[0xe] = 0;
    result_5.m_backend.data._M_elems[0xf] = 0;
    result_5.m_backend.data._M_elems[0x10] = 0;
    result_5.m_backend.data._M_elems[0x11] = 0;
    result_5.m_backend.data._M_elems[0x12] = 0;
    result_5.m_backend.data._M_elems[0x13] = 0;
    result_5.m_backend.data._M_elems[0x14] = 0;
    result_5.m_backend.data._M_elems[0x15] = 0;
    result_5.m_backend.data._M_elems[0x16] = 0;
    result_5.m_backend.data._M_elems[0x17] = 0;
    result_5.m_backend.data._M_elems[0x18] = 0;
    result_5.m_backend.data._M_elems[0x19] = 0;
    result_5.m_backend.data._M_elems._104_5_ = 0;
    result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_5.m_backend.exp = 0;
    result_5.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_5.m_backend,&enterBound.m_backend,&(this_02->theFvec->theval).m_backend);
    pnVar5 = (this_02->theFvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar17 = &result_5.m_backend;
    pnVar20 = pnVar5 + leaveIdx;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(uint *)&pnVar20->m_backend = (pcVar17->data)._M_elems[0];
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
      pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    pnVar5[leaveIdx].m_backend.exp = result_5.m_backend.exp;
    pnVar5[leaveIdx].m_backend.neg = result_5.m_backend.neg;
    pnVar5[leaveIdx].m_backend.fpclass = result_5.m_backend.fpclass;
    pnVar5[leaveIdx].m_backend.prec_elem = result_5.m_backend.prec_elem;
    updateFtest(this_02);
    pSVar18 = &local_9a8;
    pnVar16 = &local_6b0;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pSVar18->sum).m_backend.data._M_elems[0];
      pSVar18 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pSVar18 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_6b0.m_backend.exp = local_9a8.sum.m_backend.exp;
    local_6b0.m_backend.neg = local_9a8.sum.m_backend.neg;
    local_6b0.m_backend.fpclass = local_9a8.sum.m_backend.fpclass;
    local_6b0.m_backend.prec_elem = local_9a8.sum.m_backend.prec_elem;
    updateNonbasicValue(this_02,&local_6b0);
    (**(this_02->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)
              (this_00,(ulong)local_d80,&local_d70,local_d78,&this_02->theFvec->thedelta);
  }
  entertol(&reject_treshold,this_02);
  tVar7 = boost::multiprecision::operator>(&leaveMax,&reject_treshold);
  if (tVar7) {
    entertol(&enterBound,this_02);
    tVar7 = boost::multiprecision::operator<=(&local_c28,&enterBound);
    if (!tVar7) goto LAB_003da610;
LAB_003da6da:
    pnVar5 = (this_02->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar11 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&reject_treshold.m_backend,*pdVar11,(type *)0x0);
    tVar7 = boost::multiprecision::operator<
                      (pnVar5 + leaveIdx,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&reject_treshold.m_backend);
    if (tVar7) {
      if (leaveStat != P_FREE) {
LAB_003da777:
        if (leaveStat != D_FREE) {
          this_02->m_numCycle = this_02->m_numCycle + 1;
          this_02->leaveCycles = this_02->leaveCycles + 1;
          return (bool)1;
        }
        return (bool)1;
      }
    }
    else {
      pnVar5 = (this_02->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&enterBound.m_backend,-*pdVar11,(type *)0x0);
      tVar7 = boost::multiprecision::operator>
                        (pnVar5 + leaveIdx,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&enterBound.m_backend);
      if (tVar7 && leaveStat != P_FREE) goto LAB_003da777;
    }
  }
  else {
LAB_003da610:
    entertol(&newLBbound,this_02);
    pnVar16 = &newLBbound;
    pnVar19 = &newUBbound;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    newUBbound.m_backend.exp = newLBbound.m_backend.exp;
    newUBbound.m_backend.neg = newLBbound.m_backend.neg;
    newUBbound.m_backend.fpclass = newLBbound.m_backend.fpclass;
    newUBbound.m_backend.prec_elem = newLBbound.m_backend.prec_elem;
    if (newLBbound.m_backend.fpclass != cpp_dec_float_finite ||
        newUBbound.m_backend.data._M_elems[0] != 0) {
      newUBbound.m_backend.neg = (bool)(newLBbound.m_backend.neg ^ 1);
    }
    tVar7 = boost::multiprecision::operator<(&leaveMax,&newUBbound);
    if (tVar7) {
      entertol(&result_5,this_02);
      pnVar16 = &result_5;
      pnVar19 = &newCoPrhs;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      newCoPrhs.m_backend.exp = result_5.m_backend.exp;
      newCoPrhs.m_backend.neg = result_5.m_backend.neg;
      newCoPrhs.m_backend.fpclass = result_5.m_backend.fpclass;
      newCoPrhs.m_backend.prec_elem = result_5.m_backend.prec_elem;
      if (result_5.m_backend.fpclass != cpp_dec_float_finite ||
          newCoPrhs.m_backend.data._M_elems[0] != 0) {
        newCoPrhs.m_backend.neg = (bool)(result_5.m_backend.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator>=(&local_c28,&newCoPrhs);
      if (tVar7) goto LAB_003da6da;
    }
    this_02->m_numCycle = this_02->m_numCycle / 2;
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::leave(int leaveIdx, bool polish)
{
   assert(leaveIdx < dim() && leaveIdx >= 0);
   assert(type() == LEAVE);
   assert(initialized);

   bool instable = instableLeave;
   assert(!instable || instableLeaveNum >= 0);

   /*
     Before performing the actual basis update, we must determine, how this
     is to be accomplished.
     When using steepest edge pricing this solve is already performed by the pricer
   */
   if(theCoPvec->delta().isSetup() && theCoPvec->delta().size() == 0)
   {
      this->coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);
   }

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      SSVectorBase<R>  tmp(dim(), this->tolerances());
      tmp.clear();
      this->coSolve(tmp, unitVecs[leaveIdx]);
      tmp -= theCoPvec->delta();

      if(tmp.length() > leavetol())
      {
         // This happens very frequently and does usually not hurt, so print
         // these warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE60 iteration=" << basis().iteration()
                       << ": coPvec.delta error = " << tmp.length()
                       << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   setupPupdate();

   assert(thePvec->isConsistent());
   assert(theCoPvec->isConsistent());

   typename SPxBasisBase<R>::Desc::Status leaveStat;      // status of leaving var
   SPxId leaveId;        // id of leaving var
   SPxId none;           // invalid id used if leave fails
   R leaveMax;       // maximium lambda of leaving var
   R leavebound;     // current fVec value of leaving var
   int  leaveNum;       // number of leaveId in bounds
   StableSum<R> objChange; // amount of change in the objective function

   getLeaveVals(leaveIdx, leaveStat, leaveId, leaveMax, leavebound, leaveNum, objChange);

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(leaveMax > 0)
         perturbMaxLeave();
      else
         perturbMinLeave();

      //@ m_numCycle /= 2;
      // perturbation invalidates the currently stored nonbasic value
      forceRecompNonbasicValue();
   }

   //@ testBounds();

   R enterVal = leaveMax;
   boundflips = 0;
   R oldShift = theShift;
   SPxId enterId = theratiotester->selectEnter(enterVal, leaveIdx, polish);

   if(NE(theShift, oldShift, this->tolerances()->epsilon()))
   {
      SPxOut::debug(this,
                    "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n");
      forceRecompNonbasicValue();
   }

   assert(!enterId.isValid() || !isBasic(enterId));

   instableLeaveNum = -1;
   instableLeave = false;

   /*
     No variable could be selected to enter the basis and even the leaving
     variable is unbounded.
   */
   if(!enterId.isValid())
   {
      /* the following line originally was below in "rejecting leave" case;
         we need it in the unbounded/infeasible case, too, to have the
         correct basis size */
      rejectLeave(leaveNum, leaveId, leaveStat);
      this->change(-1, none, nullptr);
      objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

      if(polish)
         return false;

      if(NE(enterVal, leaveMax, this->tolerances()->epsilon()))
      {
         SPxOut::debug(this, "DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n", leaveIdx,
                       theCoTest[leaveIdx]);

         /* In the LEAVE algorithm, when for a selected leaving variable we find only
            an instable entering variable, then the basis change is not conducted.
            Instead, we save the leaving variable's index in instableLeaveNum and scale
            theCoTest[leaveIdx] down by some factor, hoping to find a different leaving
            variable with a stable entering variable.
            If this fails, however, and no more leaving variable is found, we have to
            perform the instable basis change using instableLeaveNum. In this (and only
            in this) case, the flag instableLeave is set to true.

            enterVal != leaveMax is the case that selectEnter has found only an instable entering
            variable. We store this leaving variable for later -- if we are not already in the
            instable case: then we continue and conclude unboundedness/infeasibility */
         if(!instable)
         {
            instableLeaveNum = leaveIdx;

            // Note: These changes do not survive a refactorization
            instableLeaveVal = theCoTest[leaveIdx];
            theCoTest[leaveIdx] = instableLeaveVal / 10.0;

            return true;
         }
      }

      if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE01 factorization triggered in "
                       << "leave() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the leaving column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return true;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation */
      if(!recomputedVectors && spxAbs(enterVal) < leavetol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "ILEAVE11 clean up step to reduce numerical errors" <<
                       std::endl;)

         computeFrhs();
         SPxBasisBase<R>::solve(*theFvec, *theFrhs);
         computeFtest();

         /* only do this once per solve */
         recomputedVectors = true;

         return true;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE02 unboundedness/infeasibility found "
                    << "in leave()" << std::endl;)

      if(rep() != COLUMN)
      {
         computePrimalray4Row(enterVal);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }
      else
      {
         computeDualfarkas4Col(enterVal);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }

      return false;
   }
   else
   {
      /*
        If an entering variable has been found, a regular basis update is to
        be performed.
      */
      if(enterId != this->baseId((leaveIdx)))
      {
         const SVectorBase<R>& newVector = *enterVector(enterId);

         // update feasibility vectors
         if(solveVector2 != nullptr && solveVector3 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          *solveVector3,
                                          newVector,
                                          *solveVector2rhs,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else if(solveVector2 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());

            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          newVector,
                                          *solveVector2rhs);
         }
         else if(solveVector3 != nullptr)
         {
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector3,
                                          newVector,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else
            SPxBasisBase<R>::solve4update(theFvec->delta(), newVector);

#ifdef ENABLE_ADDITIONAL_CHECKS
         {
            SSVectorBase<R>  tmp(dim(), this->tolerances());
            SPxBasisBase<R>::solve(tmp, newVector);
            tmp -= fVec().delta();

            if(tmp.length() > entertol())
            {
               // This happens very frequently and does usually not hurt, so print
               // these warnings only with verbose level INFO2 and higher.
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE62\t(" << tmp.length() << ")\n";)
            }
         }
#endif  // ENABLE_ADDITIONAL_CHECKS

         R reject_treshold = this->tolerances()->scaleAccordingToEpsilon(default_reject_leave_tol);

         if(spxAbs(theFvec->delta()[leaveIdx]) < reject_treshold)
         {
            if(instable)
            {
               /* We are in the case that for all leaving variables only instable entering
                  variables were found: Thus, above we already accepted such an instable
                  entering variable. Now even this seems to be impossible, thus we conclude
                  unboundedness/infeasibility. */
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE03 unboundedness/infeasibility found "
                             << "in leave()" << std::endl;)

               rejectLeave(leaveNum, leaveId, leaveStat);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               /**@todo if shift() is not zero we must not conclude unboundedness */
               if(rep() == ROW)
               {
                  computePrimalray4Row(enterVal);
                  setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
               }
               else
               {
                  computeDualfarkas4Col(enterVal);
                  setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
               }

               return false;
            }
            else
            {
               theFvec->delta().clear();
               rejectLeave(leaveNum, leaveId, leaveStat, &newVector);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               SPxOut::debug(this, "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n", leaveIdx,
                             theCoTest[leaveIdx]);

               // Note: These changes do not survive a refactorization
               theCoTest[leaveIdx] *= 0.01;

               return true;
            }
         }

         //      process leaving variable
         if(leavebound > epsilon() || leavebound < -epsilon())
            theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

         //      process entering variable
         R enterBound;
         R newUBbound;
         R newLBbound;
         R newCoPrhs;

         try
         {
            getLeaveVals2(leaveMax, enterId, enterBound, newUBbound, newLBbound, newCoPrhs, objChange);
         }
         catch(const SPxException& F)
         {
            rejectLeave(leaveNum, leaveId, leaveStat);
            this->change(-1, none, nullptr);
            objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case
            throw F;
         }

         theUBbound[leaveIdx] = newUBbound;
         theLBbound[leaveIdx] = newLBbound;
         (*theCoPrhs)[leaveIdx] = newCoPrhs;

         if(enterBound > epsilon() || enterBound < -epsilon())
            theFrhs->multAdd(enterBound, newVector);

         // update pricing vectors
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vector
         theFvec->value() = -((*theFvec)[leaveIdx] - leavebound)
                            / theFvec->delta()[leaveIdx];
         theFvec->update();
         (*theFvec)[leaveIdx] = enterBound - theFvec->value();
         updateFtest();

         // update objective funtion value
         updateNonbasicValue(objChange);

         //  change basis matrix
         this->change(leaveIdx, enterId, &newVector, &(theFvec->delta()));
      }

      /*
        No entering vector has been selected from the basis. However, if the
        shift amount for |coPvec| is bounded, we are in the case, that the
        entering variable is moved from one bound to its other, before any of
        the basis feasibility variables reaches their bound. This may only
        happen in primal/columnwise case with upper and lower bounds on
        variables.
      */
      else
      {
         // @todo update obj function value here!!!
         assert(rep() == ROW);
         typename SPxBasisBase<R>::Desc& ds = this->desc();

         this->change(leaveIdx, none, nullptr);

         if(leaveStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
         {
            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLRbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLCbound[leaveNum];
            }

            theUBbound[leaveIdx] = 0;
            theLBbound[leaveIdx] = R(-infinity);
         }
         else
         {
            assert(leaveStat == SPxBasisBase<R>::Desc::P_ON_LOWER);

            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theURbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theUCbound[leaveNum];
            }

            theUBbound[leaveIdx] = R(infinity);
            theLBbound[leaveIdx] = 0;
         }

         // update copricing vector
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vectors
         theFvec->value() = 0;
         assert(theCoTest[leaveIdx] < 0.0);
         m_pricingViol += theCoTest[leaveIdx];
         theCoTest[leaveIdx] *= -1;
      }

      if((leaveMax > entertol() && enterVal <= entertol()) || (leaveMax < -entertol()
            && enterVal >= -entertol()))
      {
         if((theUBbound[leaveIdx] < R(infinity) || theLBbound[leaveIdx] > R(-infinity))
               && leaveStat != SPxBasisBase<R>::Desc::P_FREE
               && leaveStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            leaveCycles++;
         }
      }
      else
         m_numCycle /= 2;

#ifdef ENABLE_ADDITIONAL_CHECKS
      {
         VectorBase<R> tmp = fVec();
         this->multBaseWith(tmp);
         tmp -= fRhs();

         if(tmp.length() > entertol())
         {
            // This happens very frequently and does usually not hurt, so print
            // these warnings only with verbose level INFO2 and higher.
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE64\t" << basis().iteration()
                          << ": fVec error = " << tmp.length() << std::endl;)
            SPxBasisBase<R>::solve(tmp, fRhs());
            tmp -= fVec();
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE65\t(" << tmp.length() << ")\n";)
         }
      }
#endif  // ENABLE_ADDITIONAL_CHECKS

      return true;
   }
}